

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialog::selectUrl(QFileDialog *this,QUrl *url)

{
  QFileDialogPrivate *this_00;
  char cVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  cVar1 = QUrl::isValid();
  if (cVar1 != '\0') {
    if ((this_00->super_QDialogPrivate).nativeDialogInUse == true) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QFileDialogPrivate::selectFile_sys(this_00,url);
        return;
      }
      goto LAB_0049a8c9;
    }
    cVar1 = QUrl::isLocalFile();
    if (cVar1 == '\0') {
      local_40.d._0_4_ = 2;
      local_40.size._4_4_ = 0;
      local_40._4_8_ = 0;
      local_40._12_8_ = 0;
      local_28 = "default";
      QMessageLogger::warning((char *)&local_40,"Non-native QFileDialog supports only local files");
    }
    else {
      QUrl::toLocalFile();
      selectFile(this,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0049a8c9:
  __stack_chk_fail();
}

Assistant:

void QFileDialog::selectUrl(const QUrl &url)
{
    Q_D(QFileDialog);
    if (!url.isValid())
        return;

    if (d->nativeDialogInUse)
        d->selectFile_sys(url);
    else if (url.isLocalFile())
        selectFile(url.toLocalFile());
    else
        qWarning("Non-native QFileDialog supports only local files");
}